

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O2

int av1_interinter_compound_motion_search
              (AV1_COMP *cpi,MACROBLOCK *x,int_mv *cur_mv,BLOCK_SIZE bsize,PREDICTION_MODE this_mode
              )

{
  INTERINTER_COMPOUND_DATA *comp_data;
  MB_MODE_INFO *pMVar1;
  uint8_t *puVar2;
  bool bVar3;
  int tmp_rate_mv;
  int_mv tmp_mv [2];
  
  pMVar1 = *(x->e_mbd).mi;
  tmp_rate_mv = 0;
  comp_data = &pMVar1->interinter_comp;
  if ((pMVar1->interinter_comp).type == '\0') {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    puVar2 = (x->e_mbd).seg_mask;
  }
  comp_data->seg_mask = puVar2;
  if (this_mode == '\x18') {
    do_masked_motion_search_indexed(cpi,x,cur_mv,comp_data,bsize,tmp_mv,&tmp_rate_mv,2);
    *&pMVar1->mv = tmp_mv;
  }
  else if ((byte)(this_mode - 0x13) < 4) {
    bVar3 = (0x1280000UL >> ((ulong)this_mode & 0x3f) & 1) != 0;
    do_masked_motion_search_indexed(cpi,x,cur_mv,comp_data,bsize,tmp_mv,&tmp_rate_mv,(uint)bVar3);
    pMVar1->mv[bVar3] = tmp_mv[bVar3];
  }
  return tmp_rate_mv;
}

Assistant:

int av1_interinter_compound_motion_search(const AV1_COMP *const cpi,
                                          MACROBLOCK *x,
                                          const int_mv *const cur_mv,
                                          const BLOCK_SIZE bsize,
                                          const PREDICTION_MODE this_mode) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  int_mv tmp_mv[2];
  int tmp_rate_mv = 0;
  // TODO(jingning): The average compound mode has proper SAD and variance
  // functions implemented, and is triggerd by setting the mask pointer as
  // Null. Need to further implement those for frame distance weighted mode.
  mbmi->interinter_comp.seg_mask =
      mbmi->interinter_comp.type == COMPOUND_AVERAGE ? NULL : xd->seg_mask;
  const INTERINTER_COMPOUND_DATA *compound_data = &mbmi->interinter_comp;

  if (this_mode == NEW_NEWMV) {
    do_masked_motion_search_indexed(cpi, x, cur_mv, compound_data, bsize,
                                    tmp_mv, &tmp_rate_mv, 2);
    mbmi->mv[0].as_int = tmp_mv[0].as_int;
    mbmi->mv[1].as_int = tmp_mv[1].as_int;
  } else if (this_mode >= NEAREST_NEWMV && this_mode <= NEW_NEARMV) {
    // which = 1 if this_mode == NEAREST_NEWMV || this_mode == NEAR_NEWMV
    // which = 0 if this_mode == NEW_NEARESTMV || this_mode == NEW_NEARMV
    int which = (NEWMV == compound_ref1_mode(this_mode));
    do_masked_motion_search_indexed(cpi, x, cur_mv, compound_data, bsize,
                                    tmp_mv, &tmp_rate_mv, which);
    mbmi->mv[which].as_int = tmp_mv[which].as_int;
  }
  return tmp_rate_mv;
}